

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCFile.cpp
# Opt level: O3

void __thiscall
ASCFile::parse_pin(ASCFile *this,char **p,char **s,char **arena,char **arena_end,
                  line_iterator_t *line_it)

{
  string *this_00;
  byte bVar1;
  BRDPartMountingSide BVar2;
  iterator __position;
  double dVar3;
  double dVar4;
  ASCFile *pAVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  ulong **__dest;
  long *plVar9;
  char *pcVar10;
  undefined8 *puVar11;
  pointer pBVar12;
  ulong *puVar13;
  long *plVar14;
  ulong uVar15;
  byte *pbVar16;
  byte *pbVar17;
  size_type __dnew;
  BRDPart part;
  ulong *local_1a0;
  long local_198;
  ulong local_190;
  long lStack_188;
  long *local_180;
  undefined8 local_178;
  long local_170;
  undefined8 uStack_168;
  ASCFile *local_160;
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  undefined1 local_138 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_120;
  char *pcStack_110;
  uint uStack_108;
  int iStack_104;
  int iStack_100;
  BRDPoint BStack_fc;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ulong **local_90;
  ulong *local_88;
  ulong *local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if (this->m_firstpin == true) {
    line_it->_M_current = line_it->_M_current + 7;
    this->m_firstpin = false;
    return;
  }
  pcVar10 = *p;
  iVar7 = strncmp(pcVar10,"Part",4);
  if (iVar7 == 0) {
    pbVar16 = (byte *)(pcVar10 + 4);
    *p = (char *)pbVar16;
    local_138._8_8_ = &aStack_120;
    local_138._0_4_ = 0;
    local_138._4_4_ = 0;
    local_138._16_8_ = 0;
    aStack_120._M_allocated_capacity = aStack_120._M_allocated_capacity & 0xffffffffffffff00;
    pcStack_110 = (char *)0x0;
    uStack_108 = 0;
    iStack_104 = 0;
    iStack_100 = 0;
    BStack_fc.x = 0;
    BStack_fc.y = 0;
    bVar6 = pcVar10[4];
    if (bVar6 != 0) {
      pbVar16 = (byte *)(pcVar10 + 5);
      do {
        iVar7 = isspace((uint)bVar6);
        if (iVar7 == 0) break;
        *p = (char *)pbVar16;
        bVar6 = *pbVar16;
        pbVar16 = pbVar16 + 1;
      } while (bVar6 != 0);
      pbVar16 = pbVar16 + -1;
    }
    *s = (char *)pbVar16;
    pbVar16 = (byte *)*p;
    bVar6 = *pbVar16;
    if (bVar6 != 0) {
      pbVar16 = pbVar16 + 1;
      do {
        iVar7 = isspace((uint)bVar6);
        if (iVar7 != 0) break;
        *p = (char *)pbVar16;
        bVar6 = *pbVar16;
        pbVar16 = pbVar16 + 1;
      } while (bVar6 != 0);
      pbVar16 = pbVar16 + -1;
    }
    *pbVar16 = 0;
    *p = *p + 1;
    local_138._0_8_ = fix_to_utf8(*s,arena,*arena_end);
    pcStack_110 = (char *)((ulong)pcStack_110 & 0xffffffff);
    pbVar16 = (byte *)*p;
    bVar6 = *pbVar16;
    if (bVar6 != 0) {
      pbVar16 = pbVar16 + 1;
      do {
        iVar7 = isspace((uint)bVar6);
        if (iVar7 == 0) break;
        *p = (char *)pbVar16;
        bVar6 = *pbVar16;
        pbVar16 = pbVar16 + 1;
      } while (bVar6 != 0);
      pbVar16 = pbVar16 + -1;
    }
    *s = (char *)pbVar16;
    pbVar16 = (byte *)*p;
    bVar6 = *pbVar16;
    if (bVar6 != 0) {
      pbVar16 = pbVar16 + 1;
      do {
        iVar7 = isspace((uint)bVar6);
        if (iVar7 != 0) break;
        *p = (char *)pbVar16;
        bVar6 = *pbVar16;
        pbVar16 = pbVar16 + 1;
      } while (bVar6 != 0);
      pbVar16 = pbVar16 + -1;
    }
    *pbVar16 = 0;
    *p = *p + 1;
    pcVar10 = fix_to_utf8(*s,arena,*arena_end);
    iVar7 = strcmp(pcVar10,"(T)");
    pcStack_110 = (char *)CONCAT44(pcStack_110._4_4_,(iVar7 == 0) + Bottom);
    uStack_108 = 0;
    std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
              (&(this->super_BRDFileBase).parts,(value_type *)local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._8_8_ == &aStack_120) {
      return;
    }
    operator_delete((void *)local_138._8_8_,aStack_120._M_allocated_capacity + 1);
    return;
  }
  local_138._16_8_ = (ulong)(uint)local_138._20_4_ << 0x20;
  aStack_120._M_allocated_capacity = 0x1ea23f;
  aStack_120._8_8_ = 0.5;
  pcStack_110 = (char *)0x0;
  uStack_108 = 0;
  iStack_104 = 0;
  local_138._8_8_ =
       (ulong)(uint)((int)((ulong)((long)(this->super_BRDFileBase).parts.
                                         super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->super_BRDFileBase).parts.
                                        super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39
                    ) << 0x20;
  strtol(pcVar10,p,10);
  pbVar16 = (byte *)*p;
  bVar6 = *pbVar16;
  local_160 = this;
  if (bVar6 != 0) {
    pbVar16 = pbVar16 + 1;
    do {
      iVar7 = isspace((uint)bVar6);
      if (iVar7 == 0) break;
      *p = (char *)pbVar16;
      bVar6 = *pbVar16;
      pbVar16 = pbVar16 + 1;
    } while (bVar6 != 0);
    pbVar16 = pbVar16 + -1;
  }
  *s = (char *)pbVar16;
  pbVar16 = (byte *)*p;
  bVar6 = *pbVar16;
  if (bVar6 != 0) {
    pbVar17 = pbVar16 + 1;
    do {
      bVar1 = *pbVar17;
      if (bVar1 == 0) break;
      iVar7 = isspace((uint)bVar6);
      if ((iVar7 != 0) && (iVar7 = isspace((uint)bVar1), iVar7 != 0)) goto LAB_00128d61;
      pbVar16 = pbVar16 + 1;
      *p = (char *)pbVar17;
      bVar6 = *pbVar17;
      pbVar17 = pbVar17 + 1;
    } while (bVar6 != 0);
    pbVar16 = pbVar17 + -1;
  }
LAB_00128d61:
  *pbVar16 = 0;
  *p = *p + 1;
  fix_to_utf8(*s,arena,*arena_end);
  dVar3 = strtod(*p,p);
  dVar4 = strtod(*p,p);
  local_138._4_4_ = (int)(dVar4 * 1000.0);
  local_138._0_4_ = (int)(dVar3 * 1000.0);
  strtol(*p,p,10);
  pAVar5 = local_160;
  pbVar16 = (byte *)*p;
  bVar6 = *pbVar16;
  if (bVar6 != 0) {
    pbVar16 = pbVar16 + 1;
    do {
      iVar7 = isspace((uint)bVar6);
      if (iVar7 == 0) break;
      *p = (char *)pbVar16;
      bVar6 = *pbVar16;
      pbVar16 = pbVar16 + 1;
    } while (bVar6 != 0);
    pbVar16 = pbVar16 + -1;
  }
  *s = (char *)pbVar16;
  pbVar16 = (byte *)*p;
  bVar6 = *pbVar16;
  if (bVar6 != 0) {
    pbVar16 = pbVar16 + 1;
    do {
      iVar7 = isspace((uint)bVar6);
      if (iVar7 != 0) break;
      *p = (char *)pbVar16;
      bVar6 = *pbVar16;
      pbVar16 = pbVar16 + 1;
    } while (bVar6 != 0);
    pbVar16 = pbVar16 + -1;
  }
  *pbVar16 = 0;
  *p = *p + 1;
  aStack_120._M_allocated_capacity = (size_type)fix_to_utf8(*s,arena,*arena_end);
  lVar8 = strtol(*p,p,10);
  iVar7 = (int)lVar8;
  if (-1 < iVar7) goto LAB_00129428;
  local_90 = local_80;
  local_158 = (ulong *)0x79;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_158);
  puVar13 = local_158;
  local_80[0] = local_158;
  local_90 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/ASCFile.cpp"
         ,0x79);
  local_88 = puVar13;
  *(undefined1 *)((long)__dest + (long)puVar13) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar13 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar13) {
    local_190 = *puVar13;
    lStack_188 = plVar9[3];
    local_1a0 = &local_190;
  }
  else {
    local_190 = *puVar13;
    local_1a0 = (ulong *)*plVar9;
  }
  local_198 = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_158 = local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,'\x02');
  *(undefined2 *)local_158 = 0x3036;
  uVar15 = 0xf;
  if (local_1a0 != &local_190) {
    uVar15 = local_190;
  }
  if (uVar15 < (ulong)(local_150 + local_198)) {
    uVar15 = 0xf;
    if (local_158 != local_148) {
      uVar15 = local_148[0];
    }
    if (uVar15 < (ulong)(local_150 + local_198)) goto LAB_00129082;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_1a0);
  }
  else {
LAB_00129082:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_158);
  }
  local_180 = &local_170;
  plVar9 = puVar11 + 2;
  if ((long *)*puVar11 == plVar9) {
    local_170 = *plVar9;
    uStack_168 = puVar11[3];
  }
  else {
    local_170 = *plVar9;
    local_180 = (long *)*puVar11;
  }
  local_178 = puVar11[1];
  *puVar11 = plVar9;
  puVar11[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
  local_f0 = &local_e0;
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_e0 = *plVar14;
    lStack_d8 = plVar9[3];
  }
  else {
    local_e0 = *plVar14;
    local_f0 = (long *)*plVar9;
  }
  local_e8 = plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_d0 = &local_c0;
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_c0 = *plVar14;
    lStack_b8 = plVar9[3];
  }
  else {
    local_c0 = *plVar14;
    local_d0 = (long *)*plVar9;
  }
  local_c8 = plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0 = &local_a0;
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_a0 = *plVar14;
    lStack_98 = plVar9[3];
  }
  else {
    local_a0 = *plVar14;
    local_b0 = (long *)*plVar9;
  }
  local_a8 = plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_60 = *plVar14;
    lStack_58 = plVar9[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar14;
    local_70 = (long *)*plVar9;
  }
  local_68 = plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_40 = *plVar14;
    lStack_38 = plVar9[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar14;
    local_50 = (long *)*plVar9;
  }
  local_48 = plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  this_00 = &(pAVar5->super_BRDFileBase).error_msg;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,(long)local_80[0] + 1);
  }
  SDL_LogError(1,"%s",(this_00->_M_dataplus)._M_p);
LAB_00129428:
  local_138._8_4_ = iVar7;
  BVar2 = (pAVar5->super_BRDFileBase).parts.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].mounting_side;
  if (BVar2 < (Top|Bottom)) {
    local_138._16_4_ = BVar2;
  }
  __position._M_current =
       (pAVar5->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pAVar5->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<BRDPin,std::allocator<BRDPin>>::_M_realloc_insert<BRDPin_const&>
              ((vector<BRDPin,std::allocator<BRDPin>> *)&(pAVar5->super_BRDFileBase).pins,__position
               ,(BRDPin *)local_138);
    pBVar12 = (pAVar5->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (__position._M_current)->name = (char *)CONCAT44(iStack_104,uStack_108);
    (__position._M_current)->radius = (double)aStack_120._8_8_;
    (__position._M_current)->snum = pcStack_110;
    *(undefined8 *)&(__position._M_current)->side = local_138._16_8_;
    (__position._M_current)->net = (char *)aStack_120._M_allocated_capacity;
    ((__position._M_current)->pos).x = local_138._0_4_;
    ((__position._M_current)->pos).y = local_138._4_4_;
    (__position._M_current)->probe = iVar7;
    (__position._M_current)->part = local_138._12_4_;
    pBVar12 = (pAVar5->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
              _M_impl.super__Vector_impl_data._M_finish + 1;
    (pAVar5->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar12;
  }
  (pAVar5->super_BRDFileBase).parts.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].end_of_pins =
       (int)((ulong)((long)pBVar12 -
                    (long)(pAVar5->super_BRDFileBase).pins.
                          super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) * -0x49249249;
  return;
}

Assistant:

void ASCFile::parse_pin(char *&p, char *&s, char *&arena, char *&arena_end, line_iterator_t &line_it) {
	if (m_firstpin) {
		line_it += 7; // Skip 7+1 unused lines before 1st part
		m_firstpin = false;
		return;
	}
	if (!strncmp(p, "Part", 4)) {
		p += 4; // Skip "Part" string
		BRDPart part;

		part.name      = READ_STR();
		part.part_type = BRDPartType::SMD;
		char *loc      = READ_STR();
		if (!strcmp(loc, "(T)"))
			part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
		else
			part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
		part.end_of_pins       = 0;
		parts.push_back(part);
	} else {
		BRDPin pin;

		pin.part = parts.size();
		/*int id =*/READ_INT(); // uint
		/*char *name =*/READ_STR2();
		double posx = READ_DOUBLE();
		pin.pos.x   = posx * 1000.0f;
		double posy = READ_DOUBLE();
		pin.pos.y   = posy * 1000.0f;
		/*int layer =*/READ_INT(); // uint
		pin.net   = READ_STR();
		pin.probe = READ_UINT();
		switch (parts.back().mounting_side) {
			case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
			case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
			case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
		}
		pins.push_back(pin);
		parts.back().end_of_pins = pins.size();
	}
}